

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact.hpp
# Opt level: O1

vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactCorrelationMatrix::compact
          (vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           *__return_storage_ptr__,CompactCorrelationMatrix *this)

{
  uint uVar1;
  double *pdVar2;
  pointer puVar3;
  pointer puVar4;
  pointer ptVar5;
  long lVar6;
  iterator __position;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  allocator_type local_8d;
  int local_8c;
  vector<int,_std::allocator<int>_> local_88;
  tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_> local_68;
  ulong local_48;
  double local_40;
  ulong local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar2 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    uVar10 = this->ndigit_ - 2;
    local_48 = 0;
    if (uVar10 < 5) {
      local_48 = (ulong)*(uint *)(&DAT_0021f754 + (ulong)uVar10 * 4);
    }
    local_40 = 1.0;
    if (uVar10 < 5) {
      local_40 = *(double *)(&DAT_0021f768 + (ulong)uVar10 * 8);
    }
    puVar3 = (this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->j_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar13 = *pdVar2 * local_40;
    local_8c = 0;
    if (1.0 < ABS(dVar13)) {
      if (dVar13 <= 0.0) {
        dVar13 = floor(ABS(dVar13));
        dVar13 = -dVar13;
      }
      else {
        dVar13 = floor(dVar13);
      }
      local_8c = (int)dVar13;
    }
    __l._M_len = 1;
    __l._M_array = &local_8c;
    std::vector<int,_std::allocator<int>_>::vector(&local_88,__l,&local_8d);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,&local_88);
    local_68.
    super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
    super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
    super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = *puVar4;
    local_68.
    super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
    super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>._28_4_ = *puVar3;
    std::
    vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
    ::emplace_back<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>
              ((vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
                *)__return_storage_ptr__,&local_68);
    if (local_68.
        super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
        super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
        super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
        super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_68.
                      super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                      _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar8 = (long)(this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if ((uVar8 & 0x3fffffff8) != 0) {
      local_38 = local_48 & 0xffffffff;
      lVar12 = 0;
      do {
        puVar3 = (this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ptVar5 = (__return_storage_ptr__->
                 super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (puVar3[lVar12 + 1] ==
            *(uint *)&ptVar5[-1].
                      super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .field_0x1c) {
          lVar6 = *(long *)&ptVar5[-1].
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl;
          lVar9 = (long)*(pointer *)
                         ((long)&ptVar5[-1].
                                 super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .
                                 super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                 super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                 ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl
                         + 8) - lVar6;
          uVar11 = lVar9 >> 2;
          if (local_38 <= uVar11) goto LAB_00199b56;
          puVar4 = (this->j_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = puVar4[lVar12 + 1];
          uVar1 = ptVar5[-1].
                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                  .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
                  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
          if ((int)local_48 + uVar1 <= uVar10) {
            dVar13 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar12 + 1] * local_40;
            iVar7 = 0;
            if (1.0 < ABS(dVar13)) {
              if (dVar13 <= 0.0) {
                dVar13 = floor(ABS(dVar13));
                dVar13 = -dVar13;
              }
              else {
                dVar13 = floor(dVar13);
              }
              iVar7 = (int)dVar13;
            }
            __l_01._M_len = 1;
            __l_01._M_array = &local_8c;
            local_8c = iVar7;
            std::vector<int,_std::allocator<int>_>::vector(&local_88,__l_01,&local_8d);
            local_68.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_68.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            local_68.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_68.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = puVar4[lVar12 + 1];
            local_68.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>._28_4_ =
                 puVar3[lVar12 + 1];
            std::
            vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
            ::
            emplace_back<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>
                      ((vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
                        *)__return_storage_ptr__,&local_68);
            goto LAB_00199c12;
          }
          uVar10 = uVar10 - (uVar1 + (int)uVar11);
          if (0 < (int)uVar10) {
            local_68.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_68.
                                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                  ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            std::vector<int,_std::allocator<int>_>::_M_fill_insert
                      ((vector<int,_std::allocator<int>_> *)(ptVar5 + -1),(int *)(lVar6 + lVar9),
                       (ulong)uVar10,(value_type_conflict1 *)&local_68);
          }
          ptVar5 = (__return_storage_ptr__->
                   super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          dVar13 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar12 + 1] * local_40;
          iVar7 = 0;
          if (1.0 < ABS(dVar13)) {
            if (dVar13 <= 0.0) {
              dVar13 = floor(ABS(dVar13));
              dVar13 = -dVar13;
            }
            else {
              dVar13 = floor(dVar13);
            }
            iVar7 = (int)dVar13;
          }
          local_68.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_68.
                                 super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .
                                 super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                 super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                 ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,iVar7);
          __position._M_current =
               *(pointer *)
                ((long)&ptVar5[-1].
                        super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                        .
                        super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                        .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                        super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                        _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
          if (__position._M_current ==
              *(pointer *)
               ((long)&ptVar5[-1].
                       super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                       .
                       super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                       .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                       super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                       _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)(ptVar5 + -1),__position,
                       (int *)&local_68);
          }
          else {
            *__position._M_current = iVar7;
            *(int **)((long)&ptVar5[-1].
                             super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                             .
                             super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                             .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                             super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                             _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                 = __position._M_current + 1;
          }
        }
        else {
LAB_00199b56:
          puVar4 = (this->j_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar13 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar12 + 1] * local_40;
          iVar7 = 0;
          if (1.0 < ABS(dVar13)) {
            if (dVar13 <= 0.0) {
              dVar13 = floor(ABS(dVar13));
              dVar13 = -dVar13;
            }
            else {
              dVar13 = floor(dVar13);
            }
            iVar7 = (int)dVar13;
          }
          __l_00._M_len = 1;
          __l_00._M_array = &local_8c;
          local_8c = iVar7;
          std::vector<int,_std::allocator<int>_>::vector(&local_88,__l_00,&local_8d);
          local_68.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_68.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_68.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_68.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = puVar4[lVar12 + 1];
          local_68.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>._28_4_ =
               puVar3[lVar12 + 1];
          std::
          vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
          ::emplace_back<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>
                    ((vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
                      *)__return_storage_ptr__,&local_68);
LAB_00199c12:
          if (local_68.
              super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
              .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
              super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
              super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              != (pointer)0x0) {
            operator_delete(local_68.
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                  ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                  ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        lVar12 = lVar12 + 1;
      } while ((uVar8 >> 2 & 0xffffffff) - 1 != lVar12);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< std::tuple< unsigned int, unsigned int,
                         std::vector< int > > > compact() const {

  // this code is not pretty, but the INTG records are just dumb so ...

  std::vector< std::tuple< unsigned int, unsigned int,
                           std::vector< int > > > lines;
  if ( this->correlations_.size() != 0 ) {

    // the maximum number of values per line
    unsigned int n = 0;
    switch ( this->NDIGIT() ) {

      case 2: { n = 18; break; }
      case 3: { n = 13; break; }
      case 4: { n = 11; break; }
      case 5: { n =  9; break; }
      case 6: { n =  8; break; }
      default: { /* unreachable */ break; }
    }

    // conversion factor
    double factor = 1;
    switch ( this->NDIGIT() ) {

      case 2: { factor = 100; break; }
      case 3: { factor = 1000; break; }
      case 4: { factor = 10000; break; }
      case 5: { factor = 100000; break; }
      case 6: { factor = 1000000; break; }
      default: { /* unreachable */ break; }
    }

    // conversion function
    auto convert = [factor] ( double value ) -> int {

      value *= factor;
      if ( std::abs( value ) <= 1. ) {

        return 0;
      }
      if ( value > 0. ) {

        return std::floor( value );
      }
      else {

        return -std::floor( std::abs( value ) );
      }
    };

    // compact the correlation matrix
    lines.push_back( { this->i_[0], this->j_[0], { convert( this->correlations_[0] ) } } );
    unsigned int size = this->i_.size();
    for ( unsigned int i = 1; i < size; ++i ) {

      if ( ( this->i_[i] == std::get< 0 >( lines.back() ) ) &&
           ( std::get< 2 >( lines.back() ) ).size() < n ) {

        if ( this->j_[i] < std::get< 1 >( lines.back() ) + n ) {

          int pad = this->j_[i] - std::get< 1 >( lines.back() ) - std::get< 2 >( lines.back() ).size();
          if ( pad > 0 ) {

            std::get< 2 >( lines.back() ).insert( std::get< 2 >( lines.back() ).end(),
                                                  pad,
                                                  0 );
          }
          std::get< 2 >( lines.back() ).emplace_back( convert( this->correlations_[i] ) );
        }
        else {

          lines.emplace_back( std::make_tuple (
                                this->i_[i],
                                this->j_[i],
                                std::vector< int >{ convert( this->correlations_[i] ) } ) );
        }
      }
      else {

        lines.emplace_back( std::make_tuple (
                              this->i_[i],
                              this->j_[i],
                              std::vector< int >{ convert( this->correlations_[i] ) } ) );
      }
    }
  }

  return lines;
}